

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[33],unsigned_int,char[56],unsigned_int,char[77]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [33],uint *RestArgs,char (*RestArgs_1) [56],uint *RestArgs_2,
               char (*RestArgs_3) [77])

{
  char (*RestArgs_local_3) [77];
  uint *RestArgs_local_2;
  char (*RestArgs_local_1) [56];
  uint *RestArgs_local;
  char (*FirstArg_local) [33];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[33]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_int,char[56],unsigned_int,char[77]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}